

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O1

void __thiscall gvr::ColoredPointCloud::loadPLY(ColoredPointCloud *this,PLYReader *ply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  size_t *psVar4;
  bool bVar5;
  bool bVar6;
  ply_type pVar7;
  ply_type pVar8;
  long lVar9;
  ulong uVar10;
  float _scale;
  UInt8Receiver cg;
  UInt8Receiver cr;
  FloatArrayReceiver ss;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  FloatArrayReceiver vx;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  UInt8Receiver cb;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_300;
  string local_2e0;
  UInt8Receiver local_2c0;
  UInt8Receiver local_2a0;
  FloatArrayReceiver local_280;
  ply_type local_25c;
  FloatArrayReceiver local_258;
  FloatArrayReceiver local_238;
  FloatArrayReceiver local_218;
  FloatArrayReceiver local_1f8;
  FloatArrayReceiver local_1d8;
  FloatArrayReceiver local_1b8;
  long local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  UInt8Receiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  psVar3 = &local_1f8.size;
  local_1f8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vertex","");
  lVar9 = PLYReader::instancesOfElement(ply,(string *)&local_1f8);
  if (local_1f8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_1f8.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  local_1f8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vertex","");
  local_1b8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_1b8.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"scan_size","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_1f8,(string *)&local_1b8);
  uVar10 = 1;
  if (pVar7 == ply_none) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vertex","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"scan_error","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_b0,&local_d0);
    if (pVar8 != ply_none) goto LAB_00119847;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"vertex","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"scan_conf","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_f0,&local_110);
    uVar10 = (ulong)(pVar8 != ply_none);
    bVar6 = true;
  }
  else {
LAB_00119847:
    bVar6 = false;
  }
  local_1d8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_1d8.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"vertex","");
  local_280.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_280.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"sx","");
  local_198 = lVar9;
  local_25c = PLYReader::getTypeOfProperty(ply,(string *)&local_1d8,(string *)&local_280);
  if (local_25c != ply_none) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vertex","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sy","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_130,&local_150);
    if (pVar8 != ply_none) {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"vertex","");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"sz","");
      PLYReader::getTypeOfProperty(ply,&local_170,&local_190);
      bVar5 = true;
      goto LAB_001199c6;
    }
  }
  bVar5 = false;
LAB_001199c6:
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,local_198,uVar10);
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  if (local_25c != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_280.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_280.size) {
    operator_delete(local_280.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_1d8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_1d8.size) {
    operator_delete(local_1d8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_1b8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_1b8.size) {
    operator_delete(local_1b8.super_PLYReceiver._vptr_PLYReceiver);
  }
  psVar3 = &local_280.size;
  if (local_1f8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_1f8.size) {
    operator_delete(local_1f8.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_1f8,(this->super_PointCloud).vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_1b8,(this->super_PointCloud).vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_1d8,(this->super_PointCloud).vertex,3,2);
  local_280.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"vertex","");
  psVar4 = &local_218.size;
  local_218.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"x","");
  PLYReader::setReceiver(ply,(string *)&local_280,(string *)&local_218,&local_1f8.super_PLYReceiver)
  ;
  if (local_218.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_218.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_280.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_280.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_280.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"vertex","");
  local_218.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"y","");
  PLYReader::setReceiver(ply,(string *)&local_280,(string *)&local_218,&local_1b8.super_PLYReceiver)
  ;
  if (local_218.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_218.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_280.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_280.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_280.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"vertex","");
  local_218.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"z","");
  PLYReader::setReceiver(ply,(string *)&local_280,(string *)&local_218,&local_1d8.super_PLYReceiver)
  ;
  if (local_218.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_218.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_280.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_280.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_280,(this->super_PointCloud).scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_218,(this->super_PointCloud).scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_50,(this->super_PointCloud).scanprop,3,2);
  if ((this->super_PointCloud).scanprop != (float *)0x0) {
    psVar3 = &local_238.size;
    local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"vertex","");
    psVar4 = &local_258.size;
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"scan_size","");
    PLYReader::setReceiver
              (ply,(string *)&local_238,(string *)&local_258,&local_280.super_PLYReceiver);
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"vertex","");
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"scan_error","");
    PLYReader::setReceiver
              (ply,(string *)&local_238,(string *)&local_258,&local_218.super_PLYReceiver);
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"vertex","");
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"scan_conf","");
    PLYReader::setReceiver
              (ply,(string *)&local_238,(string *)&local_258,&local_50.super_PLYReceiver);
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_238,(this->super_PointCloud).scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_258,(this->super_PointCloud).scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_70,(this->super_PointCloud).scanpos,3,2);
  if ((this->super_PointCloud).scanpos != (float *)0x0) {
    psVar4 = &local_2a0.offset;
    local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
    psVar3 = &local_2c0.offset;
    local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"sx","");
    PLYReader::setReceiver
              (ply,(string *)&local_2a0,(string *)&local_2c0,&local_238.super_PLYReceiver);
    if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
    local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"sy","");
    PLYReader::setReceiver
              (ply,(string *)&local_2a0,(string *)&local_2c0,&local_258.super_PLYReceiver);
    if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
    local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"sz","");
    PLYReader::setReceiver
              (ply,(string *)&local_2a0,(string *)&local_2c0,&local_70.super_PLYReceiver);
    if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  psVar4 = &local_2a0.offset;
  local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
  psVar3 = &local_2c0.offset;
  local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"diffuse_red","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_2a0,(string *)&local_2c0);
  if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (pVar7 == ply_none) {
    local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
    local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"red","");
    pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_2a0,(string *)&local_2c0);
    if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  if (pVar7 == ply_none) {
    local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
    local_2c0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"r","");
    pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_2a0,(string *)&local_2c0);
    if (local_2c0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  if (pVar7 - ply_float32 < 2) {
    _scale = 255.0;
  }
  else {
    _scale = *(float *)(&DAT_00128960 + (ulong)(pVar7 == ply_uint16) * 4);
  }
  UInt8Receiver::UInt8Receiver(&local_2a0,this->rgb,0,_scale);
  UInt8Receiver::UInt8Receiver(&local_2c0,this->rgb,1,_scale);
  UInt8Receiver::UInt8Receiver(&local_90,this->rgb,2,_scale);
  paVar1 = &local_2e0.field_2;
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  paVar2 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"diffuse_red","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2a0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"diffuse_green","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2c0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"diffuse_blue","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_90.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"red","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2a0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"green","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2c0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"blue","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_90.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"r","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2a0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"g","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_2c0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_2e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"vertex","");
  local_300._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"b","");
  PLYReader::setReceiver(ply,&local_2e0,&local_300,&local_90.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  PLYReader::readData(ply);
  return;
}

Assistant:

void ColoredPointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // set receiver for color

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // read data

  ply.readData();
}